

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_AllowExtrasOrder_Test::~TApp_AllowExtrasOrder_Test(TApp_AllowExtrasOrder_Test *this)

{
  TApp_AllowExtrasOrder_Test *this_local;
  
  ~TApp_AllowExtrasOrder_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, AllowExtrasOrder) {

    app.allow_extras();

    args = {"-x", "-f"};
    EXPECT_NO_THROW(run());
    EXPECT_EQ(app.remaining(), std::vector<std::string>({"-x", "-f"}));
    app.reset();

    std::vector<std::string> left_over = app.remaining();
    app.parse(left_over);
    EXPECT_EQ(app.remaining(), left_over);
}